

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrestlerLoader.cpp
# Opt level: O1

void __thiscall fp_remover::loaders::WrestlerLoader::clear_memory(WrestlerLoader *this)

{
  if (this->file_memory != (char *)0x0) {
    free(this->file_memory);
    this->file_memory = (char *)0x0;
  }
  if (this->chunk_location != (long *)0x0) {
    operator_delete__(this->chunk_location);
    this->chunk_location = (long *)0x0;
  }
  std::vector<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>::
  _M_erase_at_end(&(this->super_SaveLoader<fp_remover::classes::Wrestler>).contents,
                  (this->super_SaveLoader<fp_remover::classes::Wrestler>).contents.
                  super__Vector_base<fp_remover::classes::Wrestler,_std::allocator<fp_remover::classes::Wrestler>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void WrestlerLoader::clear_memory()
	{
		if(file_memory != nullptr)
		{
			free(file_memory);
			file_memory = nullptr;
		}
		if(chunk_location != nullptr)
		{
			delete [] chunk_location;
			chunk_location = nullptr;
		}
		this->contents.clear();

	}